

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwd.c
# Opt level: O0

err_t pwdGen(int argc,char **argv)

{
  int in_EDI;
  char *unaff_retaddr;
  cmd_pwd_t pwd;
  err_t code;
  undefined4 local_4;
  
  if (in_EDI == 1) {
    local_4 = cmdStDo(0);
    if (local_4 == 0) {
      local_4 = cmdPwdGen((cmd_pwd_t *)pwd,unaff_retaddr);
      cmdPwdClose((cmd_pwd_t)0x1144de);
    }
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

static err_t pwdGen(int argc, char* argv[])
{
	err_t code = ERR_OK;
	cmd_pwd_t pwd = 0;
	// верное число параметров?
	if (argc != 1)
		return ERR_CMD_PARAMS;
	// самотестирование
	code = cmdStDo(CMD_ST_BELS | CMD_ST_BELT | CMD_ST_BRNG);
	ERR_CALL_CHECK(code);
	// генерировать пароль
	code = cmdPwdGen(&pwd, *argv);
	cmdPwdClose(pwd);
	return code;
}